

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O2

BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>
 __thiscall
mp::BasicExprFactory<std::allocator<char>>::
MakeUnary<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)49,(mp::expr::Kind)49>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
          (BasicExprFactory<std::allocator<char>> *this,Kind kind,
          BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> arg)

{
  Impl *impl;
  BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>
  BVar1;
  AssertionFailure *this_00;
  
  if (arg.super_ExprBase.impl_ != (Impl *)0x0) {
    impl = Allocate<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)49,(mp::expr::Kind)49>>
                     (this,kind,0);
    impl->arg = (Impl *)arg.super_ExprBase.impl_;
    BVar1 = internal::ExprBase::
            Create<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)49,(mp::expr::Kind)49>>
                      (&impl->super_Impl);
    return (BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>
            )BVar1.super_BasicExpr<(mp::expr::Kind)49,_(mp::expr::Kind)49>.super_ExprBase.impl_;
  }
  this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
  AssertionFailure::AssertionFailure(this_00,"invalid argument");
  __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
}

Assistant:

operator SafeBool() const { return impl_ != 0 ? &ExprBase::True : 0; }